

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

int amqpvalue_encode(AMQP_VALUE value,AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context)

{
  uchar value_00;
  char value_01;
  int16_t value_02;
  uint16_t value_03;
  uint32_t uVar1;
  uint uVar2;
  AMQP_MAP_KEY_VALUE_PAIR *pairs;
  int64_t value_04;
  AMQP_VALUE *ppAVar3;
  ulong value_05;
  long value_06;
  AMQP_VALUE pAVar4;
  int iVar5;
  int iVar6;
  LOGGER_LOG p_Var7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  uint local_34;
  double local_30;
  
  if (value == (AMQP_VALUE)0x0 || encoder_output == (AMQPVALUE_ENCODER_OUTPUT)0x0) {
    p_Var7 = xlogging_get_log_function();
    iVar5 = 0x112a;
    if (p_Var7 == (LOGGER_LOG)0x0) {
      return 0x112a;
    }
    pcVar9 = "Bad arguments: value = %p, encoder_output = %p";
    iVar6 = 0x1129;
LAB_001068a9:
    (*p_Var7)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
              ,"amqpvalue_encode",iVar6,1,pcVar9,value);
  }
  else {
    switch(value->type) {
    case AMQP_TYPE_NULL:
      iVar5 = encode_null_constructor(encoder_output,context);
      if (iVar5 == 0) {
        return 0;
      }
      p_Var7 = xlogging_get_log_function();
      iVar5 = 0x924;
      if (p_Var7 == (LOGGER_LOG)0x0) {
        return 0x924;
      }
      pcVar9 = "encode_null";
      pcVar10 = "Failed encoding NULL";
      iVar6 = 0x923;
      break;
    case AMQP_TYPE_BOOL:
      if ((value->value).ubyte_value == '\0') {
        local_34 = CONCAT31(local_34._1_3_,0x42);
        iVar5 = (*encoder_output)(context,(uchar *)&local_34,1);
        if (iVar5 == 0) {
          return 0;
        }
        p_Var7 = xlogging_get_log_function();
        iVar5 = 0x972;
        if (p_Var7 == (LOGGER_LOG)0x0) {
          return 0x972;
        }
        pcVar9 = "encode_boolean";
        pcVar10 = "Failed encoding boolean";
        iVar6 = 0x971;
      }
      else {
        local_34 = CONCAT31(local_34._1_3_,0x41);
        iVar5 = (*encoder_output)(context,(uchar *)&local_34,1);
        if (iVar5 == 0) {
          return 0;
        }
        p_Var7 = xlogging_get_log_function();
        iVar5 = 0x980;
        if (p_Var7 == (LOGGER_LOG)0x0) {
          return 0x980;
        }
        pcVar9 = "encode_boolean";
        pcVar10 = "Failed encoding boolean";
        iVar6 = 0x97f;
      }
      break;
    case AMQP_TYPE_UBYTE:
      value_00 = (value->value).ubyte_value;
      iVar5 = encode_ubyte_constructor(encoder_output,context);
      if ((iVar5 == 0) && (iVar5 = encode_ubyte_value(encoder_output,context,value_00), iVar5 == 0))
      {
        return 0;
      }
      p_Var7 = xlogging_get_log_function();
      iVar5 = 0x9bc;
      if (p_Var7 == (LOGGER_LOG)0x0) {
        return 0x9bc;
      }
      pcVar9 = "encode_ubyte";
      pcVar10 = "Failed encoding ubyte";
      iVar6 = 0x9bb;
      break;
    case AMQP_TYPE_USHORT:
      value_03 = (value->value).ushort_value;
      iVar5 = encode_ushort_constructor(encoder_output,context);
      if ((iVar5 == 0) && (iVar5 = encode_ushort_value(encoder_output,context,value_03), iVar5 == 0)
         ) {
        return 0;
      }
      p_Var7 = xlogging_get_log_function();
      iVar5 = 0x9f9;
      if (p_Var7 == (LOGGER_LOG)0x0) {
        return 0x9f9;
      }
      pcVar9 = "encode_ushort";
      pcVar10 = "Failed encoding ushort";
      iVar6 = 0x9f8;
      break;
    case AMQP_TYPE_UINT:
      uVar2 = (value->value).uint_value;
      if (uVar2 == 0) {
        local_34 = CONCAT31(local_34._1_3_,0x43);
        iVar5 = (*encoder_output)(context,(uchar *)&local_34,1);
        if (iVar5 == 0) {
          return 0;
        }
        p_Var7 = xlogging_get_log_function();
        iVar5 = 0xa60;
        if (p_Var7 == (LOGGER_LOG)0x0) {
          return 0xa60;
        }
        pcVar9 = "encode_uint";
        pcVar10 = "Failed encoding uint";
        iVar6 = 0xa5f;
      }
      else {
        iVar5 = encode_uint_constructor(encoder_output,context,uVar2 < 0x100);
        if ((iVar5 == 0) &&
           (iVar5 = encode_uint_value(encoder_output,context,uVar2,uVar2 < 0x100), iVar5 == 0)) {
          return 0;
        }
        p_Var7 = xlogging_get_log_function();
        iVar5 = 0xa71;
        if (p_Var7 == (LOGGER_LOG)0x0) {
          return 0xa71;
        }
        pcVar9 = "encode_uint";
        pcVar10 = "Failed encoding uint";
        iVar6 = 0xa70;
      }
      break;
    case AMQP_TYPE_ULONG:
      value_05 = (value->value).ulong_value;
      if (value_05 == 0) {
        local_34 = CONCAT31(local_34._1_3_,0x44);
        iVar5 = (*encoder_output)(context,(uchar *)&local_34,1);
        if (iVar5 == 0) {
          return 0;
        }
        p_Var7 = xlogging_get_log_function();
        iVar5 = 0xadd;
        if (p_Var7 == (LOGGER_LOG)0x0) {
          return 0xadd;
        }
        pcVar9 = "encode_ulong";
        pcVar10 = "Failed encoding ulong";
        iVar6 = 0xadc;
      }
      else {
        iVar5 = encode_ulong_constructor(encoder_output,context,value_05 < 0x100);
        if ((iVar5 == 0) &&
           (iVar5 = encode_ulong_value(encoder_output,context,value_05,value_05 < 0x100), iVar5 == 0
           )) {
          return 0;
        }
        p_Var7 = xlogging_get_log_function();
        iVar5 = 0xaee;
        if (p_Var7 == (LOGGER_LOG)0x0) {
          return 0xaee;
        }
        pcVar9 = "encode_ulong";
        pcVar10 = "Failed encoding ulong";
        iVar6 = 0xaed;
      }
      break;
    case AMQP_TYPE_BYTE:
      value_01 = (value->value).byte_value;
      iVar5 = encode_byte_constructor(encoder_output,context);
      if ((iVar5 == 0) && (iVar5 = encode_byte_value(encoder_output,context,value_01), iVar5 == 0))
      {
        return 0;
      }
      p_Var7 = xlogging_get_log_function();
      iVar5 = 0xb2b;
      if (p_Var7 == (LOGGER_LOG)0x0) {
        return 0xb2b;
      }
      pcVar9 = "encode_byte";
      pcVar10 = "Failed encoding byte";
      iVar6 = 0xb2a;
      break;
    case AMQP_TYPE_SHORT:
      value_02 = (value->value).short_value;
      iVar5 = encode_short_constructor(encoder_output,context);
      if ((iVar5 == 0) && (iVar5 = encode_short_value(encoder_output,context,value_02), iVar5 == 0))
      {
        return 0;
      }
      p_Var7 = xlogging_get_log_function();
      iVar5 = 0xb68;
      if (p_Var7 == (LOGGER_LOG)0x0) {
        return 0xb68;
      }
      pcVar9 = "encode_short";
      pcVar10 = "Failed encoding short";
      iVar6 = 0xb67;
      break;
    case AMQP_TYPE_INT:
      iVar5 = (value->value).int_value;
      iVar6 = encode_int_constructor(encoder_output,context,(char)iVar5 == iVar5);
      if ((iVar6 == 0) &&
         (iVar5 = encode_int_value(encoder_output,context,iVar5,iVar5 + 0x80U < 0x100), iVar5 == 0))
      {
        return 0;
      }
      p_Var7 = xlogging_get_log_function();
      iVar5 = 0xbcc;
      if (p_Var7 == (LOGGER_LOG)0x0) {
        return 0xbcc;
      }
      pcVar9 = "encode_int";
      pcVar10 = "Failed encoding int";
      iVar6 = 0xbcb;
      break;
    case AMQP_TYPE_LONG:
      value_06 = (value->value).long_value;
      iVar5 = encode_long_constructor(encoder_output,context,(char)value_06 == value_06);
      if ((iVar5 == 0) &&
         (iVar5 = encode_long_value(encoder_output,context,value_06,value_06 + 0x80U < 0x100),
         iVar5 == 0)) {
        return 0;
      }
      p_Var7 = xlogging_get_log_function();
      iVar5 = 0xc34;
      if (p_Var7 == (LOGGER_LOG)0x0) {
        return 0xc34;
      }
      pcVar9 = "encode_long";
      pcVar10 = "Failed encoding long";
      iVar6 = 0xc33;
      break;
    case AMQP_TYPE_FLOAT:
      local_30 = (double)CONCAT44(local_30._4_4_,(value->value).uint_value);
      iVar5 = encode_float_constructor(encoder_output,context);
      if (iVar5 == 0) {
        iVar5 = encode_float_value(encoder_output,context,local_30._0_4_);
        if (iVar5 == 0) {
          return 0;
        }
      }
      p_Var7 = xlogging_get_log_function();
      iVar5 = 0xc74;
      if (p_Var7 == (LOGGER_LOG)0x0) {
        return 0xc74;
      }
      pcVar9 = "encode_float";
      pcVar10 = "Failure encoding float value";
      iVar6 = 0xc73;
      break;
    case AMQP_TYPE_DOUBLE:
      local_30 = (value->value).double_value;
      iVar5 = encode_double_constructor(encoder_output,context);
      if ((iVar5 == 0) && (iVar5 = encode_double_value(encoder_output,context,local_30), iVar5 == 0)
         ) {
        return 0;
      }
      p_Var7 = xlogging_get_log_function();
      iVar5 = 0xcb8;
      if (p_Var7 == (LOGGER_LOG)0x0) {
        return 0xcb8;
      }
      pcVar9 = "encode_double";
      pcVar10 = "Failure encoding double value";
      iVar6 = 0xcb7;
      break;
    default:
      p_Var7 = xlogging_get_log_function();
      iVar5 = 0x1135;
      if (p_Var7 == (LOGGER_LOG)0x0) {
        return 0x1135;
      }
      value = (AMQP_VALUE)(ulong)value->type;
      pcVar9 = "Invalid type: %d";
      iVar6 = 0x1134;
      goto LAB_001068a9;
    case AMQP_TYPE_TIMESTAMP:
      value_04 = (value->value).long_value;
      iVar5 = encode_timestamp_constructor(encoder_output,context);
      if ((iVar5 == 0) &&
         (iVar5 = encode_timestamp_value(encoder_output,context,value_04), iVar5 == 0)) {
        return 0;
      }
      p_Var7 = xlogging_get_log_function();
      iVar5 = 0xcfb;
      if (p_Var7 == (LOGGER_LOG)0x0) {
        return 0xcfb;
      }
      pcVar9 = "encode_timestamp";
      pcVar10 = "Failed encoding timestamp";
      iVar6 = 0xcfa;
      break;
    case AMQP_TYPE_UUID:
      iVar5 = encode_uuid_constructor(encoder_output,context);
      if ((iVar5 == 0) &&
         (iVar5 = encode_uuid_value(encoder_output,context,&(value->value).ubyte_value), iVar5 == 0)
         ) {
        return 0;
      }
      p_Var7 = xlogging_get_log_function();
      iVar5 = 0xd37;
      if (p_Var7 == (LOGGER_LOG)0x0) {
        return 0xd37;
      }
      pcVar9 = "encode_uuid";
      pcVar10 = "Failed encoding uuid";
      iVar6 = 0xd36;
      break;
    case AMQP_TYPE_BINARY:
      pAVar4 = (value->value).described_value.descriptor;
      uVar2 = (value->value).binary_value.length;
      iVar5 = encode_binary_constructor(encoder_output,context,uVar2 < 0x100);
      if ((iVar5 == 0) &&
         (iVar5 = encode_binary_value(encoder_output,context,(uchar *)pAVar4,uVar2,uVar2 < 0x100),
         iVar5 == 0)) {
        return 0;
      }
      p_Var7 = xlogging_get_log_function();
      iVar5 = 0xd9b;
      if (p_Var7 == (LOGGER_LOG)0x0) {
        return 0xd9b;
      }
      pcVar9 = "encode_binary";
      pcVar10 = "Failed encoding binary";
      iVar6 = 0xd9a;
      break;
    case AMQP_TYPE_STRING:
      pAVar4 = (value->value).described_value.descriptor;
      sVar8 = strlen((char *)pAVar4);
      iVar5 = encode_string_constructor(encoder_output,context,sVar8 < 0x100);
      if ((iVar5 == 0) &&
         (iVar5 = encode_string_value(encoder_output,context,(char *)pAVar4,sVar8,sVar8 < 0x100),
         iVar5 == 0)) {
        return 0;
      }
      p_Var7 = xlogging_get_log_function();
      iVar5 = 0xe03;
      if (p_Var7 == (LOGGER_LOG)0x0) {
        return 0xe03;
      }
      pcVar9 = "encode_string";
      pcVar10 = "Failed encoding string";
      iVar6 = 0xe02;
      break;
    case AMQP_TYPE_SYMBOL:
      pAVar4 = (value->value).described_value.descriptor;
      sVar8 = strlen((char *)pAVar4);
      iVar5 = encode_symbol_constructor(encoder_output,context,sVar8 < 0x100);
      if ((iVar5 == 0) &&
         (iVar5 = encode_symbol_value(encoder_output,context,(char *)pAVar4,sVar8,sVar8 < 0x100),
         iVar5 == 0)) {
        return 0;
      }
      p_Var7 = xlogging_get_log_function();
      iVar5 = 0xe6b;
      if (p_Var7 == (LOGGER_LOG)0x0) {
        return 0xe6b;
      }
      pcVar9 = "encode_symbol";
      pcVar10 = "Failed encoding symbol";
      iVar6 = 0xe6a;
      break;
    case AMQP_TYPE_LIST:
      uVar1 = (value->value).binary_value.length;
      if (uVar1 == 0) {
        local_34 = CONCAT31(local_34._1_3_,0x45);
        iVar5 = (*encoder_output)(context,(uchar *)&local_34,1);
        if (iVar5 == 0) {
          return 0;
        }
        p_Var7 = xlogging_get_log_function();
        iVar5 = 0xf1c;
        if (p_Var7 == (LOGGER_LOG)0x0) {
          return 0xf1c;
        }
        pcVar9 = "encode_list";
        pcVar10 = "Could not output list constructor byte";
        iVar6 = 0xf1b;
      }
      else {
        ppAVar3 = (value->value).list_value.items;
        iVar5 = amqpvalue_get_encoded_list_size(ppAVar3,uVar1,&local_34);
        if (iVar5 != 0) {
          return 0xf2b;
        }
        if ((uVar1 < 0x100) && (local_34 < 0xff)) {
          iVar5 = encode_list_constructor(encoder_output,context,true);
          if ((iVar5 == 0) &&
             (iVar5 = encode_list_value(encoder_output,context,uVar1,local_34,ppAVar3,true),
             iVar5 == 0)) {
            return 0;
          }
          p_Var7 = xlogging_get_log_function();
          iVar5 = 0xf37;
          if (p_Var7 == (LOGGER_LOG)0x0) {
            return 0xf37;
          }
          pcVar9 = "encode_list";
          pcVar10 = "Failed encoding small list";
          iVar6 = 0xf36;
        }
        else {
          iVar5 = encode_list_constructor(encoder_output,context,false);
          if ((iVar5 == 0) &&
             (iVar5 = encode_list_value(encoder_output,context,uVar1,local_34,ppAVar3,false),
             iVar5 == 0)) {
            return 0;
          }
          p_Var7 = xlogging_get_log_function();
          iVar5 = 0xf47;
          if (p_Var7 == (LOGGER_LOG)0x0) {
            return 0xf47;
          }
          pcVar9 = "encode_list";
          pcVar10 = "Failed encoding large list";
          iVar6 = 0xf46;
        }
      }
      break;
    case AMQP_TYPE_MAP:
      uVar1 = (value->value).binary_value.length;
      pairs = (value->value).map_value.pairs;
      iVar5 = amqpvalue_get_encoded_map_size(pairs,uVar1,&local_34);
      if (iVar5 != 0) {
        return 0x1010;
      }
      if (((uVar1 & 0x7fffff80) == 0) && (local_34 < 0xff)) {
        iVar5 = encode_map_constructor(encoder_output,context,true);
        if ((iVar5 == 0) &&
           (iVar5 = encode_map_value(encoder_output,context,uVar1,local_34,pairs,true), iVar5 == 0))
        {
          return 0;
        }
        p_Var7 = xlogging_get_log_function();
        iVar5 = 0x101c;
        if (p_Var7 == (LOGGER_LOG)0x0) {
          return 0x101c;
        }
        pcVar9 = "encode_map";
        pcVar10 = "Could not encode small map";
        iVar6 = 0x101b;
      }
      else {
        iVar5 = encode_map_constructor(encoder_output,context,false);
        if ((iVar5 == 0) &&
           (iVar5 = encode_map_value(encoder_output,context,uVar1,local_34,pairs,false), iVar5 == 0)
           ) {
          return 0;
        }
        p_Var7 = xlogging_get_log_function();
        iVar5 = 0x102c;
        if (p_Var7 == (LOGGER_LOG)0x0) {
          return 0x102c;
        }
        pcVar9 = "encode_map";
        pcVar10 = "Could not encode large map";
        iVar6 = 0x102b;
      }
      break;
    case AMQP_TYPE_ARRAY:
      uVar1 = (value->value).binary_value.length;
      ppAVar3 = (value->value).list_value.items;
      iVar5 = amqpvalue_get_encoded_array_size(ppAVar3,uVar1,&local_34);
      if (iVar5 != 0) {
        return 0x10e5;
      }
      if ((uVar1 < 0x100) && (local_34 < 0xff)) {
        iVar5 = encode_array_constructor(encoder_output,context,true);
        if ((iVar5 == 0) &&
           (iVar5 = encode_array_value(encoder_output,context,uVar1,local_34,ppAVar3,true),
           iVar5 == 0)) {
          return 0;
        }
        p_Var7 = xlogging_get_log_function();
        iVar5 = 0x10f1;
        if (p_Var7 == (LOGGER_LOG)0x0) {
          return 0x10f1;
        }
        pcVar9 = "encode_array";
        pcVar10 = "Could not encode small array";
        iVar6 = 0x10f0;
      }
      else {
        iVar5 = encode_array_constructor(encoder_output,context,false);
        if ((iVar5 == 0) &&
           (iVar5 = encode_array_value(encoder_output,context,uVar1,local_34,ppAVar3,false),
           iVar5 == 0)) {
          return 0;
        }
        p_Var7 = xlogging_get_log_function();
        iVar5 = 0x1101;
        if (p_Var7 == (LOGGER_LOG)0x0) {
          return 0x1101;
        }
        pcVar9 = "encode_array";
        pcVar10 = "Could not encode large array";
        iVar6 = 0x1100;
      }
      break;
    case AMQP_TYPE_DESCRIBED:
    case AMQP_TYPE_COMPOSITE:
      local_34 = (uint)local_34._1_3_ << 8;
      iVar5 = (*encoder_output)(context,(uchar *)&local_34,1);
      if (iVar5 == 0) {
        iVar5 = amqpvalue_encode((value->value).described_value.descriptor,encoder_output,context);
        if ((iVar5 == 0) &&
           (iVar5 = amqpvalue_encode((value->value).described_value.value,encoder_output,context),
           iVar5 == 0)) {
          return 0;
        }
      }
      else {
        p_Var7 = xlogging_get_log_function();
        if (p_Var7 != (LOGGER_LOG)0x0) {
          (*p_Var7)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                    ,"encode_descriptor_header",0x1114,1,"Failed encoding descriptor header");
        }
      }
      p_Var7 = xlogging_get_log_function();
      iVar5 = 0x1191;
      if (p_Var7 == (LOGGER_LOG)0x0) {
        return 0x1191;
      }
      pcVar9 = "amqpvalue_encode";
      pcVar10 = "Failed encoding described or composite type";
      iVar6 = 0x1190;
    }
    (*p_Var7)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
              ,pcVar9,iVar6,1,pcVar10);
  }
  return iVar5;
}

Assistant:

int amqpvalue_encode(AMQP_VALUE value, AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_269: [If value or encoder_output are NULL, amqpvalue_encode shall fail and return a non-zero value.] */
    if ((value == NULL) ||
        (encoder_output == NULL))
    {
        LogError("Bad arguments: value = %p, encoder_output = %p",
            value, encoder_output);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;

        switch (value_data->type)
        {
        default:
            /* Codes_SRS_AMQPVALUE_01_271: [If encoding fails due to any error not specifically mentioned here, it shall return a non-zero value.] */
            LogError("Invalid type: %d", (int)value_data->type);
            result = MU_FAILURE;
            break;

        case AMQP_TYPE_NULL:
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = encode_null(encoder_output, context);
            break;

        case AMQP_TYPE_BOOL:
            result = encode_boolean(encoder_output, context, value_data->value.bool_value);
            break;

        case AMQP_TYPE_UBYTE:
            result = encode_ubyte(encoder_output, context, value_data->value.ubyte_value);
            break;

        case AMQP_TYPE_USHORT:
            result = encode_ushort(encoder_output, context, value_data->value.ushort_value);
            break;

        case AMQP_TYPE_UINT:
            result = encode_uint(encoder_output, context, value_data->value.uint_value);
            break;

        case AMQP_TYPE_ULONG:
            result = encode_ulong(encoder_output, context, value_data->value.ulong_value);
            break;

        case AMQP_TYPE_BYTE:
            result = encode_byte(encoder_output, context, value_data->value.byte_value);
            break;

        case AMQP_TYPE_SHORT:
            result = encode_short(encoder_output, context, value_data->value.short_value);
            break;

        case AMQP_TYPE_INT:
            result = encode_int(encoder_output, context, value_data->value.int_value);
            break;

        case AMQP_TYPE_LONG:
            result = encode_long(encoder_output, context, value_data->value.long_value);
            break;

        case AMQP_TYPE_FLOAT:
            result = encode_float(encoder_output, context, value_data->value.float_value);
            break;

        case AMQP_TYPE_DOUBLE:
            result = encode_double(encoder_output, context, value_data->value.double_value);
            break;

        case AMQP_TYPE_TIMESTAMP:
            result = encode_timestamp(encoder_output, context, value_data->value.timestamp_value);
            break;

        case AMQP_TYPE_UUID:
            result = encode_uuid(encoder_output, context, value_data->value.uuid_value);
            break;

        case AMQP_TYPE_BINARY:
            result = encode_binary(encoder_output, context, (const unsigned char*)value_data->value.binary_value.bytes, value_data->value.binary_value.length);
            break;

        case AMQP_TYPE_STRING:
            result = encode_string(encoder_output, context, value_data->value.string_value.chars);
            break;

        case AMQP_TYPE_SYMBOL:
            result = encode_symbol(encoder_output, context, value_data->value.symbol_value.chars);
            break;

        case AMQP_TYPE_LIST:
            result = encode_list(encoder_output, context, value_data->value.list_value.count, value_data->value.list_value.items);
            break;

        case AMQP_TYPE_ARRAY:
            result = encode_array(encoder_output, context, value_data->value.array_value.count, value_data->value.array_value.items);
            break;

        case AMQP_TYPE_MAP:
            result = encode_map(encoder_output, context, value_data->value.map_value.pair_count, value_data->value.map_value.pairs);
            break;

        case AMQP_TYPE_COMPOSITE:
        case AMQP_TYPE_DESCRIBED:
        {
            if ((encode_descriptor_header(encoder_output, context) != 0) ||
                (amqpvalue_encode(value_data->value.described_value.descriptor, encoder_output, context) != 0) ||
                (amqpvalue_encode(value_data->value.described_value.value, encoder_output, context) != 0))
            {
                LogError("Failed encoding described or composite type");
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            break;
        }
        }
    }

    return result;
}